

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mat.cpp
# Opt level: O2

Mat __thiscall Mat::Inverse(Mat *this)

{
  uint m;
  int iVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  double *pdVar5;
  double *extraout_RDX;
  Mat *in_RSI;
  double *pdVar6;
  ulong uVar7;
  Mat MVar8;
  Mat yy;
  Mat xx;
  Mat local_a8;
  Mat local_98;
  ulong local_88;
  ulong local_80;
  double *local_78;
  ulong local_70;
  double *local_68;
  Mat local_60;
  Mat local_50;
  Mat local_40;
  
  m = in_RSI->n_rows_;
  Mat(this,m,m);
  pdVar5 = this->v_;
  iVar1 = this->n_cols_;
  uVar3 = 0;
  uVar4 = 0;
  if (0 < (int)m) {
    uVar4 = (ulong)m;
  }
  pdVar6 = pdVar5;
  for (; uVar3 != uVar4; uVar3 = uVar3 + 1) {
    for (uVar7 = 0; m != uVar7; uVar7 = uVar7 + 1) {
      pdVar6[uVar7] = 0.0;
    }
    pdVar5[(iVar1 + 1) * (int)uVar3] = 1.0;
    pdVar6 = pdVar6 + iVar1;
  }
  uVar2 = in_RSI->n_cols_;
  Mat(&local_98,m);
  local_70 = (ulong)m;
  Mat(&local_a8,m);
  local_68 = local_98.v_;
  uVar3 = 0;
  local_88 = (ulong)uVar2;
  if ((int)uVar2 < 1) {
    local_88 = uVar3;
  }
  while (uVar3 != local_88) {
    local_80 = uVar3;
    local_78 = pdVar5;
    for (uVar7 = 0; uVar4 != uVar7; uVar7 = uVar7 + 1) {
      local_68[uVar7] = *pdVar5;
      Mat(&local_60,&local_98);
      GaussLin(&local_50,in_RSI,(int)&local_60);
      operator=(&local_40,&local_a8);
      ~Mat(&local_40);
      ~Mat(&local_50);
      ~Mat(&local_60);
      pdVar5 = pdVar5 + iVar1;
    }
    pdVar5 = local_78;
    for (uVar3 = 0; uVar4 != uVar3; uVar3 = uVar3 + 1) {
      *pdVar5 = local_a8.v_[uVar3];
      pdVar5 = pdVar5 + iVar1;
    }
    pdVar5 = local_78 + 1;
    uVar3 = local_80 + 1;
  }
  ~Mat(&local_a8);
  ~Mat(&local_98);
  MVar8.v_ = extraout_RDX;
  MVar8._0_8_ = this;
  return MVar8;
}

Assistant:

Mat Mat::Inverse() const
{
	int i,j;
	int n = n_rows_;
	Mat ainv(n,n);
	for (i=0; i<n; i++) {
		for (j=0; j<n; j++) ainv(i,j) = 0.;
		ainv(i,i) = 1.;
	}
	int m = n_cols_;	
	Mat xx(n), yy(n);
	for (j = 0; j < m; j++) {
		for (i=0; i<n; i++) {
			xx(i) = ainv(i,j);
			yy = GaussLin(xx,n);
		}
		for (i=0; i<n; i++)
			ainv(i,j) = yy(i);
	}
	return ainv;
}